

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelExecutionTests.cpp
# Opt level: O2

void __thiscall
agge::tests::ParallelExecutionTests::CallsInSingleThreadedObjectAreMadeInTheCurrentThread
          (ParallelExecutionTests *this)

{
  pointer ppVar1;
  uint local_120;
  allocator local_119;
  ulong local_118;
  string local_110;
  LocationInfo local_f0;
  log_container log;
  parallel p;
  thread_capture tc;
  mutex mtx;
  
  parallel::parallel(&p,1);
  log.
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  log.
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  log.
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mutex::mutex(&mtx);
  tc.super_kernel_function._vptr_kernel_function = (_func_int **)&PTR_operator___001d4c80;
  tc.log = &log;
  tc._mutex = &mtx;
  parallel::call(&p,&tc.super_kernel_function);
  local_120 = 1;
  local_118 = (long)log.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)log.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  std::__cxx11::string::string
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_119);
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x4b);
  ut::are_equal<unsigned_int,unsigned_long>(&local_120,&local_118,&local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  ppVar1 = log.
           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_118 = local_118 & 0xffffffff00000000;
  std::__cxx11::string::string
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,(allocator *)&local_120);
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x4c);
  ut::are_equal<unsigned_int,unsigned_int>((uint *)&local_118,&ppVar1->first,&local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_118 = this_thread_id();
  ppVar1 = log.
           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,(allocator *)&local_120);
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x4d);
  ut::are_equal<unsigned_long,unsigned_long>(&local_118,&ppVar1->second,&local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  parallel::call(&p,&tc.super_kernel_function);
  local_120 = 2;
  local_118 = (long)log.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)log.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  std::__cxx11::string::string
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,&local_119);
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x53);
  ut::are_equal<unsigned_int,unsigned_long>(&local_120,&local_118,&local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  ppVar1 = log.
           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_118 = local_118 & 0xffffffff00000000;
  std::__cxx11::string::string
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,(allocator *)&local_120);
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x54);
  ut::are_equal<unsigned_int,unsigned_int>((uint *)&local_118,&ppVar1[1].first,&local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_118 = this_thread_id();
  ppVar1 = log.
           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,(allocator *)&local_120);
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x55);
  ut::are_equal<unsigned_long,unsigned_long>(&local_118,&ppVar1[1].second,&local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  mutex::~mutex(&mtx);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::~_Vector_base(&log.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                 );
  parallel::~parallel(&p);
  return;
}

Assistant:

test( CallsInSingleThreadedObjectAreMadeInTheCurrentThread )
			{
				// INIT
				parallel p(1);
				thread_capture::log_container log;
				mutex mtx;
				thread_capture tc(log, mtx);

				// ACT
				p.call(tc);

				// ASSERT
				assert_equal(1u, log.size());
				assert_equal(0u, log[0].first);
				assert_equal(this_thread_id(), log[0].second);

				// ACT
				p.call(tc);

				// ASSERT
				assert_equal(2u, log.size());
				assert_equal(0u, log[1].first);
				assert_equal(this_thread_id(), log[1].second);
			}